

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

bool __thiscall
Parameter<std::pair<int,_int>_>::internalSetData<int>
          (Parameter<std::pair<int,_int>_> *this,int data)

{
  bool bVar1;
  int in_ESI;
  long in_RDI;
  bool result;
  pair<int,_int> tmp;
  pair<int,_int> local_14;
  int local_c;
  
  local_c = in_ESI;
  std::pair<int,_int>::pair<int,_int,_true>(&local_14);
  bVar1 = ParameterTraits<std::pair<int,_int>_>::convert<int>(local_c,&local_14);
  if (bVar1) {
    *(undefined1 *)(in_RDI + 0x2a) = 0;
    std::pair<int,_int>::operator=((pair<int,_int> *)(in_RDI + 0x2c),&local_14);
  }
  return bVar1;
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }